

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_isPublicId(ENCODING *enc,char *ptr,char *end,char **badPtr)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  
  pbVar3 = (byte *)(ptr + 2);
  pcVar2 = end + (-2 - (long)pbVar3);
  do {
    if ((long)pcVar2 < 2) {
      return 1;
    }
    bVar1 = *pbVar3;
    if (bVar1 == 0) {
      bVar4 = *(byte *)((long)enc[1].scanners + (ulong)pbVar3[1]);
    }
    else {
      bVar4 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 - 0xdc < 4) {
          bVar4 = 8;
        }
        else if ((bVar1 == 0xff) && (0xfd < pbVar3[1])) {
          bVar4 = 0;
        }
        else {
          bVar4 = 0x1d;
        }
      }
    }
    if (bVar4 < 0x24) {
      uVar5 = (ulong)bVar4;
      if ((0xfcb0fe600U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x4400000UL >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 != 0x15) goto LAB_00469073;
          if ((bVar1 == 0) && (pbVar3[1] == 9)) goto LAB_0046908f;
        }
        else {
          bVar4 = 0xff;
          if (bVar1 != 0) goto LAB_00469083;
          if ((char)pbVar3[1] < '\0') goto LAB_00469073;
        }
      }
    }
    else {
LAB_00469073:
      bVar4 = 0xff;
      if (bVar1 == 0) {
        bVar4 = pbVar3[1];
      }
LAB_00469083:
      if ((bVar4 != 0x40) && (bVar4 != 0x24)) {
LAB_0046908f:
        *badPtr = (char *)pbVar3;
        return 0;
      }
    }
    pbVar3 = pbVar3 + 2;
    pcVar2 = pcVar2 + -2;
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(isPublicId)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **badPtr)
{
  ptr += MINBPC(enc);
  end -= MINBPC(enc);
  for (; HAS_CHAR(enc, ptr, end); ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_DIGIT:
    case BT_HEX:
    case BT_MINUS:
    case BT_APOS:
    case BT_LPAR:
    case BT_RPAR:
    case BT_PLUS:
    case BT_COMMA:
    case BT_SOL:
    case BT_EQUALS:
    case BT_QUEST:
    case BT_CR:
    case BT_LF:
    case BT_SEMI:
    case BT_EXCL:
    case BT_AST:
    case BT_PERCNT:
    case BT_NUM:
#ifdef XML_NS
    case BT_COLON:
#endif
      break;
    case BT_S:
      if (CHAR_MATCHES(enc, ptr, ASCII_TAB)) {
        *badPtr = ptr;
        return 0;
      }
      break;
    case BT_NAME:
    case BT_NMSTRT:
      if (!(BYTE_TO_ASCII(enc, ptr) & ~0x7f))
        break;
      /* fall through */
    default:
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case 0x24: /* $ */
      case 0x40: /* @ */
        break;
      default:
        *badPtr = ptr;
        return 0;
      }
      break;
    }
  }
  return 1;
}